

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O0

void __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::push
          (iterator *this,iter_result *e)

{
  node_type nVar1;
  node_type node_type;
  iter_result *e_local;
  iterator *this_local;
  
  nVar1 = detail::basic_node_ptr<unodb::detail::node_header>::type(&e->node);
  if (nVar1 == LEAF) {
    push_leaf(this,(node_ptr)(e->node).tagged_ptr);
  }
  push(this,(node_ptr)(e->node).tagged_ptr,e->key_byte,e->child_index,e->prefix);
  return;
}

Assistant:

void push(const typename inode_base::iter_result& e) {
      const auto node_type = e.node.type();
      if (UNODB_DETAIL_UNLIKELY(node_type == node_type::LEAF)) {
        push_leaf(e.node);
      }
      push(e.node, e.key_byte, e.child_index, e.prefix);
    }